

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 5.c
# Opt level: O3

int array_time_func(unqlite_context *pCtx,int argc,unqlite_value **argv)

{
  tm *ptVar1;
  unqlite_value *pArray;
  unqlite_value *pVal;
  int iVar2;
  time_t tt;
  time_t local_30;
  
  time(&local_30);
  ptVar1 = localtime(&local_30);
  pArray = unqlite_context_new_array(pCtx);
  pVal = unqlite_context_new_scalar(pCtx);
  if (pVal == (unqlite_value *)0x0 || pArray == (unqlite_value *)0x0) {
    unqlite_context_throw_error(pCtx,1,"Fatal, out of memory");
    iVar2 = -10;
  }
  else {
    unqlite_value_int(pVal,ptVar1->tm_hour);
    iVar2 = 0;
    unqlite_array_add_elem(pArray,(unqlite_value *)0x0,pVal);
    unqlite_value_int(pVal,ptVar1->tm_min);
    unqlite_array_add_elem(pArray,(unqlite_value *)0x0,pVal);
    unqlite_value_int(pVal,ptVar1->tm_sec);
    unqlite_array_add_elem(pArray,(unqlite_value *)0x0,pVal);
    unqlite_result_value(pCtx,pArray);
  }
  return iVar2;
}

Assistant:

int array_time_func(unqlite_context *pCtx, int argc, unqlite_value **argv)
{
	unqlite_value *pArray;    /* Our JSON Array */
	unqlite_value *pValue;    /* Array entries value */
	struct tm *pNow;
	/* Get the current time first */
#if defined(_MSC_VER) || defined(__MINGW32__)
    errno_t err;
    __time64_t long_time;
    struct tm newtime;
    _time64( &long_time );
    err = _localtime64_s(&newtime, &long_time);
    if (err != 0) return UNQLITE_INVALID;
    pNow = &newtime;
#else
    time_t tt;
    time(&tt);
	pNow = localtime(&tt);
#endif
	/* Create a new array */
	pArray = unqlite_context_new_array(pCtx);
	/* Create a worker scalar value */
	pValue = unqlite_context_new_scalar(pCtx);
	if( pArray == 0 || pValue == 0 ){
		/*
		 * If the supplied memory subsystem is so sick that we are unable
		 * to allocate a tiny chunk of memory, there is no much we can do here.
		 * Abort immediately.
		 */
		unqlite_context_throw_error(pCtx, UNQLITE_CTX_ERR, "Fatal, out of memory");
		/* emulate the die() construct */
		return UNQLITE_ABORT; 
	}
	/* Populate the array.
	 * Note that we will use the same worker scalar value (pValue) here rather than
	 * allocating a new value for each array entry. This is due to the fact
	 * that the populated array will make it's own private copy of the inserted
	 * key(if available) and it's associated value.
	 */
	
	unqlite_value_int(pValue, pNow->tm_hour); /* Hour */
	/* Insert the hour at the first available index */
	unqlite_array_add_elem(pArray, 0/* NULL: Assign an automatic index*/, pValue /* Will make it's own copy */);

	/* Overwrite the previous value */
	unqlite_value_int(pValue, pNow->tm_min); /* Minutes */
	/* Insert minutes */
	unqlite_array_add_elem(pArray, 0/* NULL: Assign an automatic index*/, pValue /* Will make it's own copy */);

	/* Overwrite the previous value */
	unqlite_value_int(pValue, pNow->tm_sec); /* Seconds */
	/* Insert seconds */
	unqlite_array_add_elem(pArray, 0/* NULL: Assign an automatic index*/, pValue /* Will make it's own copy */);

	/* Return the array as the function return value */
	unqlite_result_value(pCtx, pArray);

	/* All done. Don't worry about freeing memory here, every
	 * allocated resource will be released automatically by the engine
	 * as soon we return from this foreign function.
	 */
	return UNQLITE_OK;
}